

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_noWarningForkedImport_Test::~Importer_noWarningForkedImport_Test
          (Importer_noWarningForkedImport_Test *this)

{
  Importer_noWarningForkedImport_Test *this_local;
  
  ~Importer_noWarningForkedImport_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, noWarningForkedImport)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("importer/forkedImport.cellml"));

    EXPECT_EQ(size_t(0), p->errorCount());

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());
}